

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O0

WebPMuxError MuxValidate(WebPMux *mux)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  WebPMuxError WVar4;
  long *in_RDI;
  bool bVar5;
  WebPMuxImage *images;
  int has_animation;
  WebPMuxError err;
  uint32_t flags;
  int num_alpha;
  int num_images;
  int num_vp8x;
  int num_frames;
  int num_anim;
  int num_xmp;
  int num_exif;
  int num_iccp;
  WebPMux *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint in_stack_ffffffffffffffcc;
  WebPFeatureFlags in_stack_ffffffffffffffd0;
  WebPChunkId in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int local_20;
  WebPMuxError local_4;
  
  if (in_RDI == (long *)0x0) {
    local_4 = WEBP_MUX_INVALID_ARGUMENT;
  }
  else if (*in_RDI == 0) {
    local_4 = WEBP_MUX_INVALID_ARGUMENT;
  }
  else {
    local_4 = WebPMuxGetFeatures(in_stack_ffffffffffffffb8,(uint32_t *)0x1a66a5);
    if (((((local_4 == WEBP_MUX_OK) &&
          (local_4 = ValidateChunk((WebPMux *)
                                   CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                                   in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,
                                   in_stack_ffffffffffffffcc,1,
                                   (int *)CONCAT44(in_stack_ffffffffffffffc4,
                                                   in_stack_ffffffffffffffc0)),
          local_4 == WEBP_MUX_OK)) &&
         (local_4 = ValidateChunk((WebPMux *)
                                  CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                                  in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,
                                  in_stack_ffffffffffffffcc,1,
                                  (int *)CONCAT44(in_stack_ffffffffffffffc4,
                                                  in_stack_ffffffffffffffc0)),
         local_4 == WEBP_MUX_OK)) &&
        ((local_4 = ValidateChunk((WebPMux *)
                                  CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                                  in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,
                                  in_stack_ffffffffffffffcc,1,
                                  (int *)CONCAT44(in_stack_ffffffffffffffc4,
                                                  in_stack_ffffffffffffffc0)),
         local_4 == WEBP_MUX_OK &&
         (local_4 = ValidateChunk((WebPMux *)
                                  CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                                  in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,
                                  in_stack_ffffffffffffffcc,1,
                                  (int *)CONCAT44(in_stack_ffffffffffffffc4,
                                                  in_stack_ffffffffffffffc0)),
         local_4 == WEBP_MUX_OK)))) &&
       (local_4 = ValidateChunk((WebPMux *)
                                CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                                in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,
                                in_stack_ffffffffffffffcc,1,
                                (int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                               ), local_4 == WEBP_MUX_OK)) {
      bVar5 = (in_stack_ffffffffffffffcc & 2) != 0;
      uVar2 = (uint)bVar5;
      if ((uVar2 == 0) || ((local_20 != 0 && (in_stack_ffffffffffffffdc != 0)))) {
        if ((uVar2 == 0) && ((local_20 == 1 || (0 < in_stack_ffffffffffffffdc)))) {
          local_4 = WEBP_MUX_INVALID_ARGUMENT;
        }
        else {
          if (uVar2 == 0) {
            lVar1 = *in_RDI;
            if ((lVar1 == 0) || (*(long *)(lVar1 + 0x30) != 0)) {
              return WEBP_MUX_INVALID_ARGUMENT;
            }
            if ((0 < (int)in_RDI[7]) &&
               ((*(int *)(lVar1 + 0x20) != (int)in_RDI[7] ||
                (*(int *)(lVar1 + 0x24) != *(int *)((long)in_RDI + 0x3c))))) {
              return WEBP_MUX_INVALID_ARGUMENT;
            }
          }
          local_4 = ValidateChunk((WebPMux *)
                                  CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                                  in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,
                                  in_stack_ffffffffffffffcc,1,
                                  (int *)(ulong)CONCAT14(bVar5,in_stack_ffffffffffffffc0));
          if ((local_4 == WEBP_MUX_OK) &&
             (local_4 = ValidateChunk((WebPMux *)
                                      CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                                      in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,
                                      in_stack_ffffffffffffffcc,1,
                                      (int *)CONCAT44(uVar2,in_stack_ffffffffffffffc0)),
             local_4 == WEBP_MUX_OK)) {
            if ((in_stack_ffffffffffffffd8 == 0) && (in_stack_ffffffffffffffd4 != WEBP_CHUNK_ICCP))
            {
              local_4 = WEBP_MUX_INVALID_ARGUMENT;
            }
            else {
              iVar3 = MuxHasAlpha((WebPMuxImage *)*in_RDI);
              if (iVar3 != 0) {
                if (in_stack_ffffffffffffffd8 < 1) {
                  WVar4 = WebPMuxNumChunks((WebPMux *)
                                           CONCAT44(in_stack_ffffffffffffffdc,
                                                    in_stack_ffffffffffffffd8),
                                           in_stack_ffffffffffffffd4,
                                           (int *)CONCAT44(in_stack_ffffffffffffffcc,local_4));
                  if (WVar4 != WEBP_MUX_OK) {
                    return WVar4;
                  }
                  if (0 < (int)in_stack_ffffffffffffffd0) {
                    return WEBP_MUX_INVALID_ARGUMENT;
                  }
                }
                else if ((in_stack_ffffffffffffffcc & 0x10) == 0) {
                  return WEBP_MUX_INVALID_ARGUMENT;
                }
              }
              local_4 = WEBP_MUX_OK;
            }
          }
        }
      }
      else {
        local_4 = WEBP_MUX_INVALID_ARGUMENT;
      }
    }
  }
  return local_4;
}

Assistant:

WebPMuxError MuxValidate(const WebPMux* const mux) {
  int num_iccp;
  int num_exif;
  int num_xmp;
  int num_anim;
  int num_frames;
  int num_vp8x;
  int num_images;
  int num_alpha;
  uint32_t flags;
  WebPMuxError err;

  // Verify mux is not NULL.
  if (mux == NULL) return WEBP_MUX_INVALID_ARGUMENT;

  // Verify mux has at least one image.
  if (mux->images_ == NULL) return WEBP_MUX_INVALID_ARGUMENT;

  err = WebPMuxGetFeatures(mux, &flags);
  if (err != WEBP_MUX_OK) return err;

  // At most one color profile chunk.
  err = ValidateChunk(mux, IDX_ICCP, ICCP_FLAG, flags, 1, &num_iccp);
  if (err != WEBP_MUX_OK) return err;

  // At most one EXIF metadata.
  err = ValidateChunk(mux, IDX_EXIF, EXIF_FLAG, flags, 1, &num_exif);
  if (err != WEBP_MUX_OK) return err;

  // At most one XMP metadata.
  err = ValidateChunk(mux, IDX_XMP, XMP_FLAG, flags, 1, &num_xmp);
  if (err != WEBP_MUX_OK) return err;

  // Animation: ANIMATION_FLAG, ANIM chunk and ANMF chunk(s) are consistent.
  // At most one ANIM chunk.
  err = ValidateChunk(mux, IDX_ANIM, NO_FLAG, flags, 1, &num_anim);
  if (err != WEBP_MUX_OK) return err;
  err = ValidateChunk(mux, IDX_ANMF, NO_FLAG, flags, -1, &num_frames);
  if (err != WEBP_MUX_OK) return err;

  {
    const int has_animation = !!(flags & ANIMATION_FLAG);
    if (has_animation && (num_anim == 0 || num_frames == 0)) {
      return WEBP_MUX_INVALID_ARGUMENT;
    }
    if (!has_animation && (num_anim == 1 || num_frames > 0)) {
      return WEBP_MUX_INVALID_ARGUMENT;
    }
    if (!has_animation) {
      const WebPMuxImage* images = mux->images_;
      // There can be only one image.
      if (images == NULL || images->next_ != NULL) {
        return WEBP_MUX_INVALID_ARGUMENT;
      }
      // Size must match.
      if (mux->canvas_width_ > 0) {
        if (images->width_ != mux->canvas_width_ ||
            images->height_ != mux->canvas_height_) {
          return WEBP_MUX_INVALID_ARGUMENT;
        }
      }
    }
  }

  // Verify either VP8X chunk is present OR there is only one elem in
  // mux->images_.
  err = ValidateChunk(mux, IDX_VP8X, NO_FLAG, flags, 1, &num_vp8x);
  if (err != WEBP_MUX_OK) return err;
  err = ValidateChunk(mux, IDX_VP8, NO_FLAG, flags, -1, &num_images);
  if (err != WEBP_MUX_OK) return err;
  if (num_vp8x == 0 && num_images != 1) return WEBP_MUX_INVALID_ARGUMENT;

  // ALPHA_FLAG & alpha chunk(s) are consistent.
  // Note: ALPHA_FLAG can be set when there is actually no Alpha data present.
  if (MuxHasAlpha(mux->images_)) {
    if (num_vp8x > 0) {
      // VP8X chunk is present, so it should contain ALPHA_FLAG.
      if (!(flags & ALPHA_FLAG)) return WEBP_MUX_INVALID_ARGUMENT;
    } else {
      // VP8X chunk is not present, so ALPH chunks should NOT be present either.
      err = WebPMuxNumChunks(mux, WEBP_CHUNK_ALPHA, &num_alpha);
      if (err != WEBP_MUX_OK) return err;
      if (num_alpha > 0) return WEBP_MUX_INVALID_ARGUMENT;
    }
  }

  return WEBP_MUX_OK;
}